

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_blanket(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  ushort uVar1;
  bool bVar2;
  char *txt;
  ROOM_AFFECT_DATA raf;
  AFFECT_DATA af;
  
  bVar2 = is_affected(ch,sn);
  if (bVar2) {
    txt = "You have not yet fully recovered from your last casting.\n\r";
    goto LAB_0035f64f;
  }
  uVar1 = ch->in_room->sector_type;
  if (uVar1 < 0x12) {
    if ((0x20340U >> (uVar1 & 0x1f) & 1) != 0) {
      txt = "Blanket what??\n\r";
      goto LAB_0035f64f;
    }
    if ((0x2400U >> (uVar1 & 0x1f) & 1) != 0) {
      txt = "Your magic is not powerful enough to create snow here.\n\r";
      goto LAB_0035f64f;
    }
  }
  bVar2 = is_outside(ch);
  if (bVar2) {
    if (ch->in_room->area->temp != 0) {
      init_affect_room(&raf);
      raf.where = 0;
      raf.type = gsn_blanket;
      raf.aftype = 0;
      raf.duration = 0x18;
      raf.location = 3;
      raf.modifier = 0x13 - ch->in_room->sector_type;
      raf.end_fun = blanket_melt;
      raf.tick_fun = (RAFF_FUN *)0x0;
      raf.owner = ch;
      raf.level = (short)level;
      new_affect_to_room(ch->in_room,&raf);
      init_affect(&af);
      af.where = 0;
      af.type = gsn_blanket;
      af.aftype = 7;
      af.duration = 0x18;
      af.location = 0;
      af.modifier = 0;
      af.level = (short)level;
      affect_to_char(ch,&af);
      clear_tracks(ch->in_room);
      act("A sudden gust sweeps through, bearing heavy snowflakes that rapidly blanket the ground.",
          ch,(void *)0x0,(void *)0x0,4);
      return;
    }
    txt = "It is too hot to create even magical snow right now.\n\r";
  }
  else {
    txt = "No amount of concentration will make it snow indoors.\n\r";
  }
LAB_0035f64f:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_blanket(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	ROOM_AFFECT_DATA raf;

	if (is_affected(ch, sn))
	{
		send_to_char("You have not yet fully recovered from your last casting.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type
		&& (ch->in_room->sector_type == SECT_AIR
			|| ch->in_room->sector_type == SECT_WATER
			|| ch->in_room->sector_type == SECT_UNDERWATER
			|| ch->in_room->sector_type == SECT_VERTICAL))
	{
		send_to_char("Blanket what??\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type
		&& (ch->in_room->sector_type == SECT_BURNING
			|| ch->in_room->sector_type == SECT_DESERT))
	{		
		send_to_char("Your magic is not powerful enough to create snow here.\n\r", ch);
		return;
	}

	if (!is_outside(ch))
	{
		send_to_char("No amount of concentration will make it snow indoors.\n\r", ch);
		return;
	}

	if (ch->in_room->area->temp == Temperature::Hot)
	{
		send_to_char("It is too hot to create even magical snow right now.\n\r", ch);
		return;
	}

	init_affect_room(&raf);
	raf.where = TO_ROOM_AFFECTS;
	raf.type = gsn_blanket;
	raf.aftype = AFT_SPELL;
	raf.level = level;
	raf.duration = 24;
	raf.location = APPLY_ROOM_SECT;
	raf.modifier = SECT_SNOW - ch->in_room->sector_type;
	raf.owner = ch;
	raf.end_fun = blanket_melt;
	raf.tick_fun = nullptr;
	new_affect_to_room(ch->in_room, &raf);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_blanket;
	af.aftype = AFT_TIMER;
	af.level = level;
	af.duration = 24;
	af.location = 0;
	af.modifier = 0;
	affect_to_char(ch, &af);

	clear_tracks(ch->in_room);

	act("A sudden gust sweeps through, bearing heavy snowflakes that rapidly blanket the ground.", ch, 0, 0, TO_ALL);
}